

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

Node * mainposition(Table *t,TValue *key)

{
  Node *pNVar1;
  int iVar2;
  uint uVar3;
  TValue *key_local;
  Table *t_local;
  
  switch(key->tt_ & 0x3f) {
  case 1:
    t_local = (Table *)(t->node + (int)((key->value_).b & (1 << (t->lsizenode & 0x1f)) - 1U));
    break;
  case 2:
    t_local = (Table *)(t->node +
                       ((key->value_).i & 0xffffffffU) %
                       (ulong)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
    break;
  case 3:
    pNVar1 = t->node;
    iVar2 = l_hashfloat((key->value_).n);
    t_local = (Table *)(pNVar1 + iVar2 % (int)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
    break;
  case 4:
    t_local = (Table *)(t->node +
                       (int)(*(uint *)((key->value_).f + 0xc) & (1 << (t->lsizenode & 0x1f)) - 1U));
    break;
  default:
    t_local = (Table *)(t->node +
                       ((key->value_).i & 0xffffffffU) %
                       (ulong)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
    break;
  case 0x13:
    t_local = (Table *)(t->node + (int)((key->value_).b & (1 << (t->lsizenode & 0x1f)) - 1U));
    break;
  case 0x14:
    pNVar1 = t->node;
    uVar3 = luaS_hashlongstr((TString *)(key->value_).gc);
    t_local = (Table *)(pNVar1 + (int)(uVar3 & (1 << (t->lsizenode & 0x1f)) - 1U));
    break;
  case 0x16:
    t_local = (Table *)(t->node +
                       ((key->value_).i & 0xffffffffU) %
                       (ulong)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
  }
  return (Node *)t_local;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMINT:
      return hashint(t, ivalue(key));
    case LUA_TNUMFLT:
      return hashmod(t, l_hashfloat(fltvalue(key)));
    case LUA_TSHRSTR:
      return hashstr(t, tsvalue(key));
    case LUA_TLNGSTR:
      return hashpow2(t, luaS_hashlongstr(tsvalue(key)));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    case LUA_TLCF:
      return hashpointer(t, fvalue(key));
    default:
      lua_assert(!ttisdeadkey(key));
      return hashpointer(t, gcvalue(key));
  }
}